

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_gen_prime
              (mbedtls_mpi *X,size_t nbits,int flags,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
              void *p_rng)

{
  long lVar1;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  undefined1 local_78 [8];
  mbedtls_mpi Y;
  mbedtls_mpi_uint r;
  int rounds;
  size_t n;
  size_t k;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  int flags_local;
  size_t nbits_local;
  mbedtls_mpi *X_local;
  
  if ((nbits < 3) || (0x2000 < nbits)) {
    X_local._4_4_ = -4;
  }
  else {
    mbedtls_mpi_init((mbedtls_mpi *)local_78);
    lVar1 = (nbits >> 6) + (long)(int)(uint)((nbits & 0x3f) != 0);
    if ((flags & 2U) == 0) {
      if (nbits < 0x514) {
        if (nbits < 0x352) {
          if (nbits < 0x28a) {
            if (nbits < 0x15e) {
              if (nbits < 0xfa) {
                local_8c = 0x1b;
                if (0x95 < nbits) {
                  local_8c = 0x12;
                }
              }
              else {
                local_8c = 0xc;
              }
              local_88 = local_8c;
            }
            else {
              local_88 = 8;
            }
            local_84 = local_88;
          }
          else {
            local_84 = 4;
          }
          local_80 = local_84;
        }
        else {
          local_80 = 3;
        }
        local_7c = local_80;
      }
      else {
        local_7c = 2;
      }
      r._4_4_ = local_7c;
    }
    else {
      if (nbits < 0x5aa) {
        if (nbits < 0x47e) {
          if (nbits < 1000) {
            if (nbits < 0x352) {
              if (nbits < 0x2ee) {
                if (nbits < 500) {
                  if (nbits < 0xfa) {
                    local_a8 = 0x33;
                    if (0x95 < nbits) {
                      local_a8 = 0x28;
                    }
                  }
                  else {
                    local_a8 = 0x1c;
                  }
                  local_a4 = local_a8;
                }
                else {
                  local_a4 = 0xd;
                }
                local_a0 = local_a4;
              }
              else {
                local_a0 = 8;
              }
              local_9c = local_a0;
            }
            else {
              local_9c = 7;
            }
            local_98 = local_9c;
          }
          else {
            local_98 = 6;
          }
          local_94 = local_98;
        }
        else {
          local_94 = 5;
        }
        local_90 = local_94;
      }
      else {
        local_90 = 4;
      }
      r._4_4_ = local_90;
    }
    while (k._4_4_ = mbedtls_mpi_fill_random(X,lVar1 * 8,f_rng,p_rng), k._4_4_ == 0) {
      if (0xb504f333f9de6484 < X->p[lVar1 + -1]) {
        if ((nbits < (ulong)(lVar1 * 0x40)) &&
           (k._4_4_ = mbedtls_mpi_shift_r(X,lVar1 * 0x40 - nbits), k._4_4_ != 0)) break;
        *X->p = *X->p | 1;
        if ((flags & 1U) != 0) {
          *X->p = *X->p | 2;
          k._4_4_ = mbedtls_mpi_mod_int((mbedtls_mpi_uint *)&Y.p,X,3);
          if (k._4_4_ != 0) break;
          if (Y.p == (mbedtls_mpi_uint *)0x0) {
            k._4_4_ = mbedtls_mpi_add_int(X,X,8);
joined_r0x0012871d:
            if (k._4_4_ != 0) break;
          }
          else if (Y.p == (mbedtls_mpi_uint *)0x1) {
            k._4_4_ = mbedtls_mpi_add_int(X,X,4);
            goto joined_r0x0012871d;
          }
          k._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)local_78,X);
          if ((k._4_4_ == 0) &&
             (k._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)local_78,1), k._4_4_ == 0))
          goto LAB_00128769;
          break;
        }
        k._4_4_ = mbedtls_mpi_is_prime_ext(X,r._4_4_,f_rng,p_rng);
        if (k._4_4_ != -0xe) break;
      }
    }
LAB_00128818:
    mbedtls_mpi_free((mbedtls_mpi *)local_78);
    X_local._4_4_ = k._4_4_;
  }
  return X_local._4_4_;
LAB_00128769:
  k._4_4_ = mpi_check_small_factors(X);
  if ((k._4_4_ == 0) &&
     (((k._4_4_ = mpi_check_small_factors((mbedtls_mpi *)local_78), k._4_4_ == 0 &&
       (k._4_4_ = mpi_miller_rabin(X,(long)r._4_4_,f_rng,p_rng), k._4_4_ == 0)) &&
      (k._4_4_ = mpi_miller_rabin((mbedtls_mpi *)local_78,(long)r._4_4_,f_rng,p_rng), k._4_4_ == 0))
     )) goto LAB_00128818;
  if (((k._4_4_ != -0xe) || (k._4_4_ = mbedtls_mpi_add_int(X,X,0xc), k._4_4_ != 0)) ||
     (k._4_4_ = mbedtls_mpi_add_int((mbedtls_mpi *)local_78,(mbedtls_mpi *)local_78,6), k._4_4_ != 0
     )) goto LAB_00128818;
  goto LAB_00128769;
}

Assistant:

int mbedtls_mpi_gen_prime( mbedtls_mpi *X, size_t nbits, int flags,
                   int (*f_rng)(void *, unsigned char *, size_t),
                   void *p_rng )
{
#ifdef MBEDTLS_HAVE_INT64
// ceil(2^63.5)
#define CEIL_MAXUINT_DIV_SQRT2 0xb504f333f9de6485ULL
#else
// ceil(2^31.5)
#define CEIL_MAXUINT_DIV_SQRT2 0xb504f334U
#endif
    int ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
    size_t k, n;
    int rounds;
    mbedtls_mpi_uint r;
    mbedtls_mpi Y;

    MPI_VALIDATE_RET( X     != NULL );
    MPI_VALIDATE_RET( f_rng != NULL );

    if( nbits < 3 || nbits > MBEDTLS_MPI_MAX_BITS )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    mbedtls_mpi_init( &Y );

    n = BITS_TO_LIMBS( nbits );

    if( ( flags & MBEDTLS_MPI_GEN_PRIME_FLAG_LOW_ERR ) == 0 )
    {
        /*
         * 2^-80 error probability, number of rounds chosen per HAC, table 4.4
         */
        rounds = ( ( nbits >= 1300 ) ?  2 : ( nbits >=  850 ) ?  3 :
                   ( nbits >=  650 ) ?  4 : ( nbits >=  350 ) ?  8 :
                   ( nbits >=  250 ) ? 12 : ( nbits >=  150 ) ? 18 : 27 );
    }
    else
    {
        /*
         * 2^-100 error probability, number of rounds computed based on HAC,
         * fact 4.48
         */
        rounds = ( ( nbits >= 1450 ) ?  4 : ( nbits >=  1150 ) ?  5 :
                   ( nbits >= 1000 ) ?  6 : ( nbits >=   850 ) ?  7 :
                   ( nbits >=  750 ) ?  8 : ( nbits >=   500 ) ? 13 :
                   ( nbits >=  250 ) ? 28 : ( nbits >=   150 ) ? 40 : 51 );
    }

    while( 1 )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( X, n * ciL, f_rng, p_rng ) );
        /* make sure generated number is at least (nbits-1)+0.5 bits (FIPS 186-4 §B.3.3 steps 4.4, 5.5) */
        if( X->p[n-1] < CEIL_MAXUINT_DIV_SQRT2 ) continue;

        k = n * biL;
        if( k > nbits ) MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( X, k - nbits ) );
        X->p[0] |= 1;

        if( ( flags & MBEDTLS_MPI_GEN_PRIME_FLAG_DH ) == 0 )
        {
            ret = mbedtls_mpi_is_prime_ext( X, rounds, f_rng, p_rng );

            if( ret != MBEDTLS_ERR_MPI_NOT_ACCEPTABLE )
                goto cleanup;
        }
        else
        {
            /*
             * An necessary condition for Y and X = 2Y + 1 to be prime
             * is X = 2 mod 3 (which is equivalent to Y = 2 mod 3).
             * Make sure it is satisfied, while keeping X = 3 mod 4
             */

            X->p[0] |= 2;

            MBEDTLS_MPI_CHK( mbedtls_mpi_mod_int( &r, X, 3 ) );
            if( r == 0 )
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, X, 8 ) );
            else if( r == 1 )
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, X, 4 ) );

            /* Set Y = (X-1) / 2, which is X / 2 because X is odd */
            MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Y, X ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &Y, 1 ) );

            while( 1 )
            {
                /*
                 * First, check small factors for X and Y
                 * before doing Miller-Rabin on any of them
                 */
                if( ( ret = mpi_check_small_factors(  X         ) ) == 0 &&
                    ( ret = mpi_check_small_factors( &Y         ) ) == 0 &&
                    ( ret = mpi_miller_rabin(  X, rounds, f_rng, p_rng  ) )
                                                                    == 0 &&
                    ( ret = mpi_miller_rabin( &Y, rounds, f_rng, p_rng  ) )
                                                                    == 0 )
                    goto cleanup;

                if( ret != MBEDTLS_ERR_MPI_NOT_ACCEPTABLE )
                    goto cleanup;

                /*
                 * Next candidates. We want to preserve Y = (X-1) / 2 and
                 * Y = 1 mod 2 and Y = 2 mod 3 (eq X = 3 mod 4 and X = 2 mod 3)
                 * so up Y by 6 and X by 12.
                 */
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int(  X,  X, 12 ) );
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( &Y, &Y, 6  ) );
            }
        }
    }

cleanup:

    mbedtls_mpi_free( &Y );

    return( ret );
}